

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

int mcpl_rewind(mcpl_file_t ff)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  
  lVar1 = *(long *)((long)ff.internal + 0x40);
  lVar2 = *(long *)((long)ff.internal + 0x88);
  *(undefined8 *)((long)ff.internal + 0x88) = 0;
  if ((lVar1 != 0) && (lVar2 != 0)) {
    if (*(gzFile *)((long)ff.internal + 8) == (gzFile)0x0) {
      iVar4 = fseek(*ff.internal,*(long *)((long)ff.internal + 0x80),0);
      uVar3 = (uint)(iVar4 != 0);
    }
    else {
      uVar3 = mcpl_gzseek(*(gzFile *)((long)ff.internal + 8),*(int64_t *)((long)ff.internal + 0x80))
      ;
      uVar3 = uVar3 ^ 1;
    }
    if (uVar3 != 0) {
      mcpl_error("Errors encountered while rewinding particle list");
    }
  }
  return (int)(lVar1 != 0);
}

Assistant:

int mcpl_rewind(mcpl_file_t ff)
{
  MCPLIMP_FILEDECODE;
  int already_there = (f->current_particle_idx==0);
  f->current_particle_idx = 0;
  int notEOF = f->current_particle_idx<f->nparticles;
  if (notEOF&&!already_there) {
    int error;
    if (f->filegz) {
      error = ! mcpl_gzseek( f->filegz, f->first_particle_pos );
    } else {
      error = MCPL_FSEEK( f->file, f->first_particle_pos )!=0;
    }
    if (error)
      mcpl_error("Errors encountered while rewinding particle list");
  }
  return notEOF;
}